

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O0

_Bool rtosc_match_full_path(char *pattern,char *message)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  char *m;
  char *p;
  char submessage [256];
  char subpattern [256];
  char *local_228;
  char *local_220;
  char local_218 [256];
  char local_118 [280];
  
  local_228 = in_RSI;
  local_220 = in_RDI;
  do {
    if (*local_220 != *local_228) {
      return false;
    }
    iVar1 = chunk_path(local_118,0x100,local_220);
    if (iVar1 != 0) {
      return false;
    }
    iVar1 = chunk_path(local_218,0x100,local_228);
    if (iVar1 != 0) {
      return false;
    }
    advance_path(&local_220);
    advance_path(&local_228);
  } while ((*local_220 != '\0') || (*local_228 != '\0'));
  return true;
}

Assistant:

bool rtosc_match_full_path(const char *pattern, const char *message)
{
    assert(false && "This API is a WIP");
    char subpattern[256];
    char submessage[256];
    const char *p = pattern;
    const char *m = message;

step:
    if(*p != *m)
        return 0;
    if(chunk_path(subpattern, sizeof(subpattern), p))
        return 0;
    if(chunk_path(submessage, sizeof(submessage), m))
        return 0;

    advance_path(&p);
    advance_path(&m);

    if(*p == 0 && *m == 0)
        return 1;
    else
        goto step;
}